

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLogging.cpp
# Opt level: O0

void Jinx::Impl::LogWriteLine(LogLevel level,char *format,...)

{
  size_t sVar1;
  size_t len;
  char buffer [4096];
  va_list argptr;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  char *format_local;
  LogLevel level_local;
  
  lock._8_8_ = format;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&Log::logMutex);
  if ((Log::enableLogging & 1U) != 0) {
    buffer[0xffc] = '0';
    buffer[0xffd] = '\0';
    buffer[0xffe] = '\0';
    buffer[0xfff] = '\0';
    buffer[0xff8] = '\x10';
    buffer[0xff9] = '\0';
    buffer[0xffa] = '\0';
    buffer[0xffb] = '\0';
    vsnprintf((char *)&len,0x1000,(char *)lock._8_8_,buffer + 0xff8);
    sVar1 = strlen((char *)&len);
    if (sVar1 < 0xffe) {
      buffer[sVar1 - 8] = '\n';
      buffer[sVar1 - 7] = '\0';
    }
    std::function<void_(Jinx::LogLevel,_const_char_*)>::operator()(&Log::logFn,level,(char *)&len);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

inline_t void LogWriteLine(LogLevel level, const char * format, ...)
	{
		std::unique_lock<std::mutex> lock(Log::logMutex);
		if (!Log::enableLogging)
			return;
		va_list argptr;
		va_start(argptr, format);
		char buffer[BufferSize];
#if defined(JINX_WINDOWS)
		_vsnprintf_s(buffer, BufferSize, _TRUNCATE, format, argptr);
#else
		vsnprintf(buffer, BufferSize, format, argptr);
#endif
		size_t len = strlen(buffer);
		if (len < BufferSize - 2)
		{
			buffer[len] = '\n';
			buffer[len + 1] = 0;
		}
		Log::logFn(level, buffer);
		va_end(argptr);
	}